

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_type_traits.hpp
# Opt level: O3

bitset<256UL> *
jsoncons::
json_type_traits<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::bitset<256UL>,_void>
::as(bitset<256UL> *__return_storage_ptr__,
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *j)

{
  _WordT *p_Var1;
  type_conflict9 tVar2;
  bool bVar3;
  unsigned_long uVar4;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar5;
  system_error *psVar6;
  conv_error *this;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  byte bVar11;
  byte bVar12;
  string_view_type sVar13;
  type tVar14;
  error_code __ec;
  error_code ec;
  error_code __ec_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bits;
  vector<unsigned_char,_std::allocator<unsigned_char>_> val;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  type local_58;
  error_code local_40;
  error_code local_30;
  error_code local_20;
  
  tVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
          is_integer<unsigned_long>(j);
  pbVar5 = j;
  if (tVar2) {
    uVar4 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
            as_integer<unsigned_long>(j);
    (__return_storage_ptr__->super__Base_bitset<4UL>)._M_w[1] = 0;
    (__return_storage_ptr__->super__Base_bitset<4UL>)._M_w[2] = 0;
    (__return_storage_ptr__->super__Base_bitset<4UL>)._M_w[3] = 0;
    (__return_storage_ptr__->super__Base_bitset<4UL>)._M_w[0] = uVar4;
  }
  else {
    while (uVar7 = *(byte *)&pbVar5->field_0 & 0xf, uVar7 - 8 < 2) {
      pbVar5 = *(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> **)
                ((long)&pbVar5->field_0 + 8);
    }
    if ((uVar7 != 0xc) &&
       (bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string(j),
       !bVar3)) {
      this = (conv_error *)__cxa_allocate_exception(0x58);
      std::error_code::error_code<jsoncons::conv_errc,void>(&local_40,not_bitset);
      ec._4_4_ = 0;
      ec._M_value = local_40._M_value;
      ec._M_cat = local_40._M_cat;
      conv_error::conv_error(this,ec);
      __cxa_throw(this,&conv_error::typeinfo,conv_error::~conv_error);
    }
    (__return_storage_ptr__->super__Base_bitset<4UL>)._M_w[2] = 0;
    (__return_storage_ptr__->super__Base_bitset<4UL>)._M_w[3] = 0;
    (__return_storage_ptr__->super__Base_bitset<4UL>)._M_w[0] = 0;
    (__return_storage_ptr__->super__Base_bitset<4UL>)._M_w[1] = 0;
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pbVar5 = j;
    while( true ) {
      uVar8 = *(byte *)&pbVar5->field_0 & 0xf;
      uVar7 = uVar8 - 8;
      if (1 < uVar7) break;
      pbVar5 = *(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> **)
                ((long)&pbVar5->field_0 + 8);
    }
    if (uVar8 == 0xc) {
      json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
      ::as<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                (&local_58,
                 (json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  *)j,(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                      (ulong)uVar7);
      local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
    }
    else {
      sVar13 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_string_view(j);
      tVar14 = decode_base16<char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         (sVar13._M_str,sVar13._M_str + sVar13._M_len,&local_78);
      if (tVar14.ec != success) {
        psVar6 = (system_error *)__cxa_allocate_exception(0x58);
        std::error_code::error_code<jsoncons::conv_errc,void>(&local_20,not_bitset);
        __ec_00._4_4_ = 0;
        __ec_00._M_value = local_20._M_value;
        *(undefined ***)(psVar6 + 0x50) = &PTR__json_exception_00b2f248;
        __ec_00._M_cat = local_20._M_cat;
        std::system_error::system_error(psVar6,__ec_00);
        *(undefined8 *)psVar6 = 0xb31b78;
        *(undefined8 *)(psVar6 + 0x50) = 0xb31bb0;
        *(undefined8 *)(psVar6 + 0x20) = 0;
        *(undefined8 *)(psVar6 + 0x28) = 0;
        *(system_error **)(psVar6 + 0x30) = psVar6 + 0x40;
        *(undefined8 *)(psVar6 + 0x38) = 0;
        psVar6[0x40] = (system_error)0x0;
        __cxa_throw(psVar6,&conv_error::typeinfo,conv_error::~conv_error);
      }
    }
    uVar9 = 0;
    uVar10 = 0;
    bVar12 = 0;
    bVar11 = 0;
    do {
      if (bVar12 == 0) {
        if ((ulong)((long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start) <= uVar10) {
          psVar6 = (system_error *)__cxa_allocate_exception(0x58);
          std::error_code::error_code<jsoncons::conv_errc,void>(&local_30,not_bitset);
          __ec._4_4_ = 0;
          __ec._M_value = local_30._M_value;
          *(undefined ***)(psVar6 + 0x50) = &PTR__json_exception_00b2f248;
          __ec._M_cat = local_30._M_cat;
          std::system_error::system_error(psVar6,__ec);
          *(undefined8 *)psVar6 = 0xb31b78;
          *(undefined8 *)(psVar6 + 0x50) = 0xb31bb0;
          *(undefined8 *)(psVar6 + 0x20) = 0;
          *(undefined8 *)(psVar6 + 0x28) = 0;
          *(system_error **)(psVar6 + 0x30) = psVar6 + 0x40;
          *(undefined8 *)(psVar6 + 0x38) = 0;
          psVar6[0x40] = (system_error)0x0;
          __cxa_throw(psVar6,&conv_error::typeinfo,conv_error::~conv_error);
        }
        bVar11 = local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar10];
        uVar10 = uVar10 + 1;
        bVar12 = 0x80;
      }
      if ((bVar12 & bVar11) != 0) {
        p_Var1 = (__return_storage_ptr__->super__Base_bitset<4UL>)._M_w + (uVar9 >> 6);
        *p_Var1 = *p_Var1 | 1L << ((byte)uVar9 & 0x3f);
      }
      bVar12 = bVar12 >> 1;
      uVar9 = uVar9 + 1;
    } while (uVar9 != 0x100);
    if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::bitset<N> as(const Json& j)
        {
            if (j.template is<uint64_t>())
            {
                auto bits = j.template as<uint64_t>();
                std::bitset<N> bs = static_cast<unsigned long long>(bits);
                return bs;
            }
            else if (j.is_byte_string() || j.is_string())
            {
                std::bitset<N> bs;
                std::vector<uint8_t> bits;
                if (j.is_byte_string())
                {
                    bits = j.template as<std::vector<uint8_t>>();
                }
                else
                {
                    jsoncons::string_view sv = j.as_string_view();
                    auto result = decode_base16(sv.begin(), sv.end(), bits);
                    if (result.ec != conv_errc::success)
                    {
                        JSONCONS_THROW(conv_error(conv_errc::not_bitset));
                    }
                }
                std::uint8_t byte = 0;
                std::uint8_t mask  = 0;

                std::size_t pos = 0;
                for (std::size_t i = 0; i < N; ++i)
                {
                    if (mask == 0)
                    {
                        if (pos >= bits.size())
                        {
                            JSONCONS_THROW(conv_error(conv_errc::not_bitset));
                        }
                        byte = bits.at(pos++);
                        mask = 0x80;
                    }

                    if (byte & mask)
                    {
                        bs[i] = 1;
                    }

                    mask = static_cast<std::uint8_t>(mask >> 1);
                }
                return bs;
            }
            else
            {
                JSONCONS_THROW(conv_error(conv_errc::not_bitset));
            }
        }